

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Readable.cpp
# Opt level: O2

vector<std::byte,_std::allocator<std::byte>_> * __thiscall
Cup::Properties::Readable::readBinary
          (vector<std::byte,_std::allocator<std::byte>_> *__return_storage_ptr__,Readable *this,
          string_view filename)

{
  bool bVar1;
  char cVar2;
  size_type __n;
  runtime_error *prVar3;
  path path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string message;
  directory_entry file;
  string_view filename_local;
  ifstream inputStream;
  
  filename_local._M_str = (char *)filename._M_len;
  filename_local._M_len = (size_t)this;
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            ((path *)&inputStream,&filename_local,auto_format);
  std::filesystem::absolute(&path);
  std::filesystem::__cxx11::path::~path((path *)&inputStream);
  std::filesystem::__cxx11::directory_entry::directory_entry(&file,&path);
  bVar1 = std::filesystem::__cxx11::directory_entry::exists(&file);
  if (bVar1) {
    bVar1 = std::filesystem::__cxx11::directory_entry::is_regular_file(&file);
    if (bVar1) {
      std::ifstream::ifstream(&inputStream,path._M_pathname._M_dataplus._M_p,_S_bin);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 != '\0') {
        std::istream::seekg((long)&inputStream,_S_beg);
        __n = std::istream::tellg();
        std::istream::seekg((long)&inputStream,_S_beg);
        std::vector<std::byte,_std::allocator<std::byte>_>::vector
                  (__return_storage_ptr__,__n,(allocator_type *)&message);
        std::istream::read((char *)&inputStream,
                           (long)(__return_storage_ptr__->
                                 super__Vector_base<std::byte,_std::allocator<std::byte>_>)._M_impl.
                                 super__Vector_impl_data._M_start);
        std::ifstream::~ifstream(&inputStream);
        std::filesystem::__cxx11::path::~path(&file._M_path);
        std::filesystem::__cxx11::path::~path(&path);
        return __return_storage_ptr__;
      }
      std::ifstream::~ifstream(&inputStream);
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error
                (prVar3,"An unexpected error has occurred, this exception should not be thrown");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::string::string((string *)&inputStream,(string *)&path);
  s_abi_cxx11_(&local_2f8,"The file with path <",0x14);
  std::operator+(&local_2d8,&local_2f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&inputStream);
  s_abi_cxx11_(&local_318,"> not exist, not is a regular file",0x22);
  std::operator+(&local_2b8,&local_2d8,&local_318);
  s_abi_cxx11_(&local_338," or the path is wrong.\nPlease assure that path is",0x31);
  std::operator+(&local_298,&local_2b8,&local_338);
  s_abi_cxx11_(&local_358," valid and the file not is a directory.",0x27);
  std::operator+(&message,&local_298,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2f8);
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar3,(string *)&message);
  __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<std::byte> Properties::Readable::readBinary(std::string_view filename)
{
	// Get the absolute path to file, is more simple
	// inform of error with the absolute path.
	const fs::path path(fs::absolute(filename));
	// Verify that the file exist and that it is regular file
	const fs::directory_entry file(path);

	if (file.exists() and file.is_regular_file())
	{
		// Open the file in mode only read and read of binary
		std::ifstream inputStream(path, std::ios::binary);

		// Checks if the stream has an associated file
		if (inputStream.is_open())
		{
			// You can imagine ifstream as a position,
			// and that position has the ability to
			// move through the file, you can move
			// anywhere within the file and read content
			// from that position.
			// What we want to do is determine the
			// size of the file to read it completely
			// in a single iteration, so our position
			// needs to move to the end of the file,
			// and then ask him where he is.
			inputStream.seekg(0, std::ifstream::end);
			// This is how we ask our position where it is
			const std::size_t sizeFile = inputStream.tellg();
			// To read the entire contents of the file,
			// it is necessary to move back to the beginning
			// of the file
			inputStream.seekg(0, std::ifstream::beg);

			// std::byte was introduced in C++17, allowing
			// interpret unsigned char and char as a byte

			// See the motivations of use std::byte instead
			// of unsigned char and char

			// 		Many programs require byte-oriented access
			// 		to memory. Today, such programs must use
			// 		either the char, signed char, or unsigned
			// 		char types for this purpose. However, these
			// 		types perform a “triple duty”. Not only are
			// 		they used for byte addressing, but also as
			// 		arithmetic types, and as character types.
			// 		This multiplicity of roles opens the door
			// 		for programmer error – such as accidentally
			// 		performing arithmetic on memory that should
			// 		be treated as a byte value – and confusion
			// 		for both programmers and tools.
			// Ref: http://open-std.org/JTC1/SC22/WG21/docs/papers/2016/p0298r0.pdf
			std::vector<std::byte> buffer(sizeFile);

			// The "reinterpret_cast<char*>" is necessary,
			// yet that the method read not support to read
			// of std::byte type, only of pointers (aka: arrays)
			// of type char
			inputStream.read(reinterpret_cast<char*>(buffer.data()), sizeFile);

			return buffer;
		}
	}
	else
	{
		// For create std::string in compilation
		// time is necessary say to compile that the
		// string literal [aka: const char*] will
		// be convert to std::string; note the 's'
		// added to end of string literals.
		using namespace std::string_literals;

		const std::string pathAbsolute = path;
		const std::string message = "The file with path <"s
				+ pathAbsolute + "> not exist, not is a regular file"s
				+ " or the path is wrong.\nPlease assure that path is"s
				+ " valid and the file not is a directory."s;

		throw std::runtime_error(message);
	}

	throw std::runtime_error("An unexpected error has occurred,"
						  " this exception should not be thrown");
}